

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool testing::internal::ParseFlag(char *str,char *flag_name,int32_t *value)

{
  bool bVar1;
  char *str_00;
  Message *src_text;
  char *local_30;
  char *flag_name_local;
  
  bVar1 = false;
  local_30 = flag_name;
  str_00 = ParseFlagValue(str,flag_name,false);
  if (str_00 != (char *)0x0) {
    Message::Message((Message *)&flag_name_local);
    std::operator<<((ostream *)(flag_name_local + 0x10),"The value of flag --");
    src_text = Message::operator<<((Message *)&flag_name_local,&local_30);
    bVar1 = ParseInt32(src_text,str_00,value);
    if (flag_name_local != (char *)0x0) {
      (**(code **)(*(long *)flag_name_local + 8))();
    }
  }
  return bVar1;
}

Assistant:

bool ParseFlag(const char* str, const char* flag_name, int32_t* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseFlagValue(str, flag_name, false);

  // Aborts if the parsing failed.
  if (value_str == nullptr) return false;

  // Sets *value to the value of the flag.
  return ParseInt32(Message() << "The value of flag --" << flag_name, value_str,
                    value);
}